

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatSoldier.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::Decode
          (GED_BasicGroundCombatSoldier *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x13 < KVar1) {
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16EntityID);
    KDataStream::Read<short>(stream,this->m_i16Offsets);
    KDataStream::Read<short>(stream,this->m_i16Offsets + 1);
    KDataStream::Read<short>(stream,this->m_i16Offsets + 2);
    (*(this->m_EA).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EA,stream);
    KDataStream::Read(stream,this->m_i8Ori);
    KDataStream::Read(stream,this->m_i8Ori + 1);
    KDataStream::Read(stream,this->m_i8Ori + 2);
    KDataStream::Read(stream,&this->m_i8Spd);
    KDataStream::Read(stream,&this->m_i8HdAz);
    KDataStream::Read(stream,&this->m_i8HdElv);
    KDataStream::Read(stream,&this->m_i8HdScanRt);
    KDataStream::Read(stream,&this->m_i8HdElvRt);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GED_BasicGroundCombatSoldier::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GED_BASIC_GROUND_COMBAT_SOLDIER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16EntityID
           >> m_i16Offsets[0]
           >> m_i16Offsets[1]
           >> m_i16Offsets[2]
           >> KDIS_STREAM m_EA
           >> m_i8Ori[0]
           >> m_i8Ori[1]
           >> m_i8Ori[2]
           >> m_i8Spd
           >> m_i8HdAz
           >> m_i8HdElv
           >> m_i8HdScanRt
           >> m_i8HdElvRt;
}